

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O2

void Abc_SclTimeNode(SC_Man *p,Abc_Obj_t *pObj,int fDept)

{
  float fVar1;
  SC_Pair SVar2;
  uint uVar3;
  SC_Pair *pSVar4;
  SC_Pair *pSVar5;
  SC_Pair *pSVar6;
  Abc_Obj_t *pFanin;
  SC_Pair *pSVar7;
  SC_Pair SVar8;
  SC_Pair SVar9;
  double dVar10;
  uint uVar11;
  SC_Timing *pSVar12;
  SC_Cell *pSVar13;
  long lVar14;
  float fVar15;
  SC_Pair ArrOut1;
  SC_Pair ArrOut0;
  SC_Pair SlewIn;
  SC_Pair ArrIn;
  SC_Pair LoadIn;
  SC_Pair local_88;
  SC_Pair local_78;
  SC_Pair local_70;
  SC_Pair local_68;
  SC_Pair local_60;
  SC_Pair local_58;
  SC_Pair local_50;
  SC_Pair local_48;
  undefined8 uStack_40;
  
  uVar3 = pObj->Id;
  local_48 = p->pLoads[uVar3];
  fVar15 = p->EstLoadMax;
  fVar1 = 0.0;
  if ((fVar15 != 0.0) || (NAN(fVar15))) {
    fVar1 = (local_48.fall * 0.5 + local_48.rise * 0.5) / (p->EstLoadAve * fVar15);
  }
  pSVar7 = p->pLoads + uVar3;
  uVar11 = *(uint *)&pObj->field_0x14 & 0xf;
  if ((uVar11 == 5) || (uVar11 == 2)) {
    if (fDept != 0) {
      __assert_fail("!fDept",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclSize.c"
                    ,0x142,"void Abc_SclTimeNode(SC_Man *, Abc_Obj_t *, int)");
    }
    pSVar13 = p->pPiDrive;
    if (pSVar13 != (SC_Cell *)0x0) {
      pSVar4 = p->pTimes;
      pSVar5 = p->pSlews;
      local_50.rise = 0.0;
      local_50.fall = 0.0;
      local_58.rise = 0.0;
      local_58.fall = 0.0;
      local_60.rise = 0.0;
      local_60.fall = 0.0;
      local_68.rise = 0.0;
      local_68.fall = 0.0;
      local_70.rise = 0.0;
      local_70.fall = 0.0;
      local_78.rise = 0.0;
      local_78.fall = 0.0;
      pSVar6 = pSVar5 + uVar3;
      pSVar6->rise = 0.0;
      pSVar6->fall = 0.0;
      if (pSVar13->n_inputs != 1) {
        __assert_fail("pCell->n_inputs == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLib.h"
                      ,0x2af,
                      "void Scl_LibHandleInputDriver(SC_Cell *, SC_Pair *, SC_Pair *, SC_Pair *)");
      }
      pSVar12 = Scl_CellPinTime(pSVar13,0);
      Scl_LibPinArrival(pSVar12,&local_58,&local_60,&local_50,&local_68,&local_78);
      pSVar12 = Scl_CellPinTime(pSVar13,0);
      Scl_LibPinArrival(pSVar12,&local_58,&local_60,pSVar7,&local_70,pSVar5 + uVar3);
      SVar8.fall = local_70.fall - local_68.fall;
      SVar8.rise = local_70.rise - local_68.rise;
      pSVar4[uVar3] = SVar8;
    }
  }
  else if (uVar11 - 5 < 0xfffffffe) {
    uStack_40 = 0;
    if (uVar11 != 7) {
      __assert_fail("Abc_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclSize.c"
                    ,0x150,"void Abc_SclTimeNode(SC_Man *, Abc_Obj_t *, int)");
    }
    local_88.rise = 0.0;
    local_88.fall = 0.0;
    if (((fVar15 != 0.0) || (NAN(fVar15))) && (1.0 < fVar1)) {
      fVar15 = fVar15 * p->EstLoadAve;
      pSVar7->rise = fVar15;
      pSVar7->fall = fVar15;
      if (fDept == 0) {
        local_88.rise = 0.0;
        local_88.fall = 0.0;
      }
      else {
        pSVar6 = p->pDepts;
        fVar15 = p->EstLinear;
        dVar10 = log((double)fVar1);
        fVar15 = (float)(dVar10 * (double)fVar15);
        local_88 = pSVar6[uVar3];
        SVar2.fall = fVar15 + local_88.fall;
        SVar2.rise = fVar15 + local_88.rise;
        pSVar6[uVar3] = SVar2;
      }
      p->nEstNodes = p->nEstNodes + 1;
    }
    pSVar13 = Abc_SclObjCell(pObj);
    for (lVar14 = 0; lVar14 < (pObj->vFanins).nSize; lVar14 = lVar14 + 1) {
      pFanin = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar14]];
      pSVar12 = Scl_CellPinTime(pSVar13,(int)lVar14);
      if (fDept == 0) {
        uVar3 = pFanin->Id;
        uVar11 = pObj->Id;
        Scl_LibPinArrival(pSVar12,p->pTimes + uVar3,p->pSlews + uVar3,p->pLoads + uVar11,
                          p->pTimes + uVar11,p->pSlews + uVar11);
      }
      else {
        Abc_SclDeptFanin(p,pSVar12,pObj,pFanin);
      }
    }
    if (((p->EstLoadMax != 0.0) || (NAN(p->EstLoadMax))) && (1.0 < fVar1)) {
      *pSVar7 = local_48;
      if (fDept == 0) {
        pSVar7 = p->pTimes;
        uVar3 = pObj->Id;
        fVar15 = p->EstLinear;
        dVar10 = log((double)fVar1);
        fVar15 = (float)(dVar10 * (double)fVar15);
        SVar2 = pSVar7[uVar3];
        SVar9.fall = fVar15 + SVar2.fall;
        SVar9.rise = fVar15 + SVar2.rise;
        pSVar7[uVar3] = SVar9;
      }
      else {
        p->pDepts[(uint)pObj->Id] = local_88;
      }
    }
  }
  else if (fDept == 0) {
    Abc_SclObjDupFanin(p,pObj);
    fVar15 = p->pTimes[(uint)pObj->Id].rise;
    fVar1 = p->pTimes[(uint)pObj->Id].fall;
    if (fVar15 <= fVar1) {
      fVar15 = fVar1;
    }
    Vec_FltWriteEntry(p->vTimesOut,(pObj->field_5).iData,fVar15);
    Vec_QueUpdate(p->vQue,(pObj->field_5).iData);
    return;
  }
  return;
}

Assistant:

void Abc_SclTimeNode( SC_Man * p, Abc_Obj_t * pObj, int fDept )
{
    SC_Timing * pTime;
    SC_Cell * pCell;
    int k;
    SC_Pair * pLoad = Abc_SclObjLoad( p, pObj );
    float LoadRise = pLoad->rise;
    float LoadFall = pLoad->fall;
    float DeptRise = 0;
    float DeptFall = 0;
    float Value = p->EstLoadMax ? Abc_SclObjLoadValue( p, pObj ) : 0;
    Abc_Obj_t * pFanin;
    if ( Abc_ObjIsCi(pObj) )
    {
        assert( !fDept );
        Abc_SclTimeCi( p, pObj );
        return;
    }
    if ( Abc_ObjIsCo(pObj) )
    {
        if ( !fDept )
        {
            Abc_SclObjDupFanin( p, pObj );
            Vec_FltWriteEntry( p->vTimesOut, pObj->iData, Abc_SclObjTimeMax(p, pObj) );
            Vec_QueUpdate( p->vQue, pObj->iData );
        }
        return;
    }
    assert( Abc_ObjIsNode(pObj) );
//    if ( !(Abc_ObjFaninNum(pObj) == 1 && Abc_ObjIsPi(Abc_ObjFanin0(pObj))) && p->EstLoadMax && Value > 1 )
    if ( p->EstLoadMax && Value > 1 )
    {
        pLoad->rise = p->EstLoadAve * p->EstLoadMax;
        pLoad->fall = p->EstLoadAve * p->EstLoadMax;
        if ( fDept )
        {
            SC_Pair * pDepOut  = Abc_SclObjDept( p, pObj );
            float EstDelta = p->EstLinear * log( Value );
            DeptRise = pDepOut->rise;
            DeptFall = pDepOut->fall;
            pDepOut->rise += EstDelta;
            pDepOut->fall += EstDelta;
        }
        p->nEstNodes++;
    }
    // get the library cell
    pCell = Abc_SclObjCell( pObj );
    // compute for each fanin
    Abc_ObjForEachFanin( pObj, pFanin, k )
    {
        pTime = Scl_CellPinTime( pCell, k );
        if ( fDept )
            Abc_SclDeptFanin( p, pTime, pObj, pFanin );
        else
            Abc_SclTimeFanin( p, pTime, pObj, pFanin );
    }
    if ( p->EstLoadMax && Value > 1 )
    {
        pLoad->rise = LoadRise;
        pLoad->fall = LoadFall;
        if ( fDept )
        {
            SC_Pair * pDepOut  = Abc_SclObjDept( p, pObj );
            pDepOut->rise = DeptRise;
            pDepOut->fall = DeptFall;
        }
        else
        {
            SC_Pair * pArrOut  = Abc_SclObjTime( p, pObj );
            float EstDelta = p->EstLinear * log( Value );
            pArrOut->rise += EstDelta;
            pArrOut->fall += EstDelta;
        }
    }
}